

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreePart::Evaluate
          (WindowSegmentTreePart *this,WindowSegmentTreeGlobalState *tree,idx_t *begins,idx_t *ends,
          idx_t *bounds,Vector *result,idx_t count,idx_t row_idx,FramePart frame_part)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  FramePart local_54;
  
  if (count != 0) {
    pdVar1 = (this->statef).data;
    iVar2 = 0;
    do {
      (*(this->aggr->function).initialize)
                (&this->aggr->function,*(data_ptr_t *)(pdVar1 + iVar2 * 8));
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  if (this->order_insensitive == false) {
    EvaluateLeaves(this,tree,begins,ends,bounds,count,row_idx,frame_part,LEFT);
    local_54 = RIGHT;
  }
  else {
    local_54 = FULL;
  }
  EvaluateUpperLevels(this,tree,begins,ends,bounds,count,row_idx,frame_part);
  EvaluateLeaves(this,tree,begins,ends,bounds,count,row_idx,frame_part,local_54);
  return;
}

Assistant:

void WindowSegmentTreePart::Evaluate(const WindowSegmentTreeGlobalState &tree, const idx_t *begins, const idx_t *ends,
                                     const idx_t *bounds, Vector &result, idx_t count, idx_t row_idx,
                                     FramePart frame_part) {
	Initialize(count);

	if (order_insensitive) {
		//	First pass: aggregate the segment tree nodes with sharing
		EvaluateUpperLevels(tree, begins, ends, bounds, count, row_idx, frame_part);

		//	Second pass: aggregate the ragged leaves
		EvaluateLeaves(tree, begins, ends, bounds, count, row_idx, frame_part, FramePart::FULL);
	} else {
		//	Evaluate leaves in order
		EvaluateLeaves(tree, begins, ends, bounds, count, row_idx, frame_part, FramePart::LEFT);
		EvaluateUpperLevels(tree, begins, ends, bounds, count, row_idx, frame_part);
		EvaluateLeaves(tree, begins, ends, bounds, count, row_idx, frame_part, FramePart::RIGHT);
	}
}